

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O1

int Extra_ProfileWidth(DdManager *dd,DdNode *Func,int *pProfile,int CutLevel)

{
  int iVar1;
  st__table *psVar2;
  st__generator *psVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int *piVar7;
  DdNode *node;
  int LevelStart;
  uint *local_58;
  int local_4c;
  st__table *local_48;
  st__table *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,CutLevel);
  local_40 = st__init_table(st__ptrcmp,st__ptrhash);
  extraProfileUpdateTopLevel(local_40,0,Func);
  psVar2 = st__init_table(st__ptrcmp,st__ptrhash);
  extraCollectNodes(Func,psVar2);
  local_48 = psVar2;
  psVar3 = st__init_gen(psVar2);
  iVar1 = st__gen(psVar3,(char **)&local_58,(char **)0x0);
  psVar2 = local_40;
  while (iVar1 != 0) {
    piVar7 = (int *)((ulong)local_58 & 0xfffffffffffffffe);
    if (*piVar7 != 0x7fffffff) {
      extraProfileUpdateTopLevel(psVar2,dd->perm[*local_58] + 1,*(DdNode **)(piVar7 + 6));
      extraProfileUpdateTopLevel(psVar2,dd->perm[*local_58] + 1,*(DdNode **)(piVar7 + 4));
    }
    iVar1 = st__gen(psVar3,(char **)&local_58,(char **)0x0);
  }
  st__free_gen(psVar3);
  st__free_table(local_48);
  uVar6 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar6 = dd->sizeZ;
  }
  if (-1 < (int)uVar6) {
    memset(pProfile,0,(ulong)uVar6 * 4 + 4);
  }
  local_48 = (st__table *)CONCAT44(local_48._4_4_,uVar6 + 1);
  psVar3 = st__init_gen(local_40);
  iVar1 = st__gen(psVar3,(char **)&local_58,(char **)&local_4c);
  if (iVar1 != 0) {
    do {
      piVar7 = &dd->size;
      if ((ulong)*(uint *)((ulong)local_58 & 0xfffffffffffffffe) != 0x7fffffff) {
        piVar7 = dd->perm + *(uint *)((ulong)local_58 & 0xfffffffffffffffe);
      }
      iVar1 = *piVar7;
      if (local_4c <= iVar1) {
        lVar5 = 0;
        do {
          pProfile[local_4c + lVar5] = pProfile[local_4c + lVar5] + 1;
          lVar5 = lVar5 + 1;
        } while ((iVar1 - local_4c) + 1 != (int)lVar5);
      }
      iVar1 = st__gen(psVar3,(char **)&local_58,(char **)&local_4c);
    } while (iVar1 != 0);
  }
  st__free_gen(psVar3);
  uVar6 = (uint)local_48;
  if ((uint)local_38 - 1 < 0xfffffffe) {
    uVar6 = (uint)local_38;
  }
  if ((int)uVar6 < 1) {
    iVar1 = 0;
  }
  else {
    uVar4 = 0;
    iVar1 = 0;
    do {
      if (iVar1 <= pProfile[uVar4]) {
        iVar1 = pProfile[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  st__free_table(local_40);
  return iVar1;
}

Assistant:

int Extra_ProfileWidth( DdManager * dd, DdNode * Func, int * pProfile, int CutLevel )
{
    st__generator * gen;
    st__table * tNodeTopRef; // this table stores the top level from which this node is pointed to
    st__table * tNodes;
    DdNode * node;
    DdNode * nodeR;
    int LevelStart, Limit;
    int i, size;
    int WidthMax;
  
    // start the mapping table
    tNodeTopRef = st__init_table( st__ptrcmp, st__ptrhash);;
    // add the topmost node to the profile
    extraProfileUpdateTopLevel( tNodeTopRef, 0, Func );

    // collect all nodes
    tNodes = Extra_CollectNodes( Func );
    // go though all the nodes and set the top level the cofactors are pointed from
//  Cudd_ForeachNode( dd, Func, genDD, node )
    st__foreach_item( tNodes, gen, (const char**)&node, NULL )
    {
//      assert( Cudd_Regular(node) );  // this procedure works only with ADD/ZDD (not BDD w/ compl.edges)
        nodeR = Cudd_Regular(node);
        if ( cuddIsConstant(nodeR) )
            continue;
        // this node is not a constant - consider its cofactors
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddE(nodeR) );
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddT(nodeR) );
    }
    st__free_table( tNodes );

    // clean the profile
    size = ddMax(dd->size, dd->sizeZ) + 1;
    for ( i = 0; i < size; i++ ) 
        pProfile[i] = 0;

    // create the profile
    st__foreach_item( tNodeTopRef, gen, (const char**)&node, (char**)&LevelStart )
    {
        nodeR = Cudd_Regular(node);
        Limit = (cuddIsConstant(nodeR))? dd->size: dd->perm[nodeR->index];
        for ( i = LevelStart; i <= Limit; i++ )
            pProfile[i]++;
    }

    if ( CutLevel != -1 && CutLevel != 0  )
        size = CutLevel;

    // get the max width
    WidthMax = 0;
    for ( i = 0; i < size; i++ ) 
        if ( WidthMax < pProfile[i] )
            WidthMax = pProfile[i];

    // deref the table
    st__free_table( tNodeTopRef );

    return WidthMax;
}